

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::CaseInsensitiveStringEquals<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2)

{
  bool bVar1;
  char *lhs;
  char *rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  size_t local_38;
  size_t i2;
  size_t i1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  value_type nul;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1_local;
  
  pbStack_20 = s2;
  s2_local = s1;
  lhs = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  bVar1 = CaseInsensitiveCStringEquals(lhs,rhs);
  if (bVar1) {
    i1._7_1_ = 0;
    i2 = std::__cxx11::string::find((char)s2_local,0);
    local_38 = std::__cxx11::string::find((char)pbStack_20,0);
    if ((i2 == 0xffffffffffffffff) || (local_38 == 0xffffffffffffffff)) {
      s1_local._7_1_ = i2 == local_38;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)s2_local);
      std::__cxx11::string::substr((ulong)&local_78,(ulong)pbStack_20);
      s1_local._7_1_ = CaseInsensitiveStringEquals<std::__cxx11::string>(&local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  else {
    s1_local._7_1_ = 0;
  }
  return (bool)(s1_local._7_1_ & 1);
}

Assistant:

bool CaseInsensitiveStringEquals(const StringType& s1, const StringType& s2) {
  // Are the heads equal?
  if (!CaseInsensitiveCStringEquals(s1.c_str(), s2.c_str())) {
    return false;
  }

  // Skip the equal heads.
  const typename StringType::value_type nul = 0;
  const size_t i1 = s1.find(nul), i2 = s2.find(nul);

  // Are we at the end of either s1 or s2?
  if (i1 == StringType::npos || i2 == StringType::npos) {
    return i1 == i2;
  }

  // Are the tails equal?
  return CaseInsensitiveStringEquals(s1.substr(i1 + 1), s2.substr(i2 + 1));
}